

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O2

Test * __thiscall
testing::internal::
TestFactoryImpl<bssl::gtest_suite_CertIssuerSourceSyncNormalizationTest_::MultipleMatchesAfterNormalization<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>_>
::CreateTest(TestFactoryImpl<bssl::gtest_suite_CertIssuerSourceSyncNormalizationTest_::MultipleMatchesAfterNormalization<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>_>
             *this)

{
  CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate> *this_00
  ;
  
  this_00 = (CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>
             *)operator_new(0x100);
  bssl::CertIssuerSourceSyncTest<bssl::(anonymous_namespace)::CertIssuerSourceStaticTestDelegate>::
  CertIssuerSourceSyncTest(this_00);
  (this_00->super_Test)._vptr_Test = (_func_int **)&PTR__CertIssuerSourceSyncTest_0058f8b8;
  return &this_00->super_Test;
}

Assistant:

Test* CreateTest() override { return new TestClass; }